

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O3

ssize_t __thiscall Pl_PNGFilter::write(Pl_PNGFilter *this,int __fd,void *__buf,size_t __n)

{
  void *in_RAX;
  long lVar1;
  undefined4 in_register_00000034;
  uchar *__s;
  size_t sVar2;
  size_t sVar3;
  void *__n_00;
  
  sVar2 = this->pos;
  __n_00 = (void *)(this->incoming - sVar2);
  if (__buf < __n_00) {
    lVar1 = 0;
    sVar3 = sVar2;
  }
  else {
    sVar3 = 0;
    lVar1 = 0;
    do {
      memcpy(this->cur_row + sVar2,(void *)(CONCAT44(in_register_00000034,__fd) + lVar1),
             (size_t)__n_00);
      processRow(this);
      __s = this->prev_row;
      this->prev_row = this->cur_row;
      if (__s == (uchar *)0x0) {
        __s = (this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      lVar1 = lVar1 + (long)__n_00;
      __buf = (void *)((long)__buf - (long)__n_00);
      this->cur_row = __s;
      in_RAX = memset(__s,0,(ulong)(this->bytes_per_row + 1));
      __n_00 = (void *)this->incoming;
      this->pos = 0;
      sVar2 = 0;
    } while (__n_00 <= __buf);
  }
  if (__buf != (void *)0x0) {
    in_RAX = memcpy(this->cur_row + sVar3,(void *)(CONCAT44(in_register_00000034,__fd) + lVar1),
                    (size_t)__buf);
    sVar3 = this->pos;
  }
  this->pos = sVar3 + (long)__buf;
  return (ssize_t)in_RAX;
}

Assistant:

void
Pl_PNGFilter::write(unsigned char const* data, size_t len)
{
    size_t left = this->incoming - this->pos;
    size_t offset = 0;
    while (len >= left) {
        // finish off current row
        memcpy(this->cur_row + this->pos, data + offset, left);
        offset += left;
        len -= left;

        processRow();

        // Swap rows
        unsigned char* t = this->prev_row;
        this->prev_row = this->cur_row;
        this->cur_row = t ? t : this->buf2.get();
        memset(this->cur_row, 0, this->bytes_per_row + 1);
        left = this->incoming;
        this->pos = 0;
    }
    if (len) {
        memcpy(this->cur_row + this->pos, data + offset, len);
    }
    this->pos += len;
}